

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> * __thiscall
llvm::DWARFUnit::determineStringOffsetsTableContribution
          (Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *__return_storage_ptr__
          ,DWARFUnit *this,DWARFDataExtractor *DA)

{
  DwarfFormat Format;
  bool bVar1;
  char *pcVar2;
  unsigned_long *puVar3;
  reference Val;
  Optional<unsigned_long> OVar4;
  undefined1 local_c8 [24];
  undefined1 local_b0 [8];
  Expected<llvm::StrOffsetsContributionDescriptor> DescOrError;
  Optional<llvm::DWARFFormValue> local_80;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_48;
  Optional<unsigned_long> OptOffset;
  uint64_t local_28;
  uint64_t Offset;
  DWARFDataExtractor *DA_local;
  DWARFUnit *this_local;
  
  if ((this->IsDWO & 1U) == 0) {
    join_0x00000010_0x00000000_ = getUnitDIE(this,true);
    DWARFDie::find(&local_80,(DWARFDie *)&DescOrError.field_0x18,DW_AT_str_offsets_base);
    OVar4 = dwarf::toSectionOffset(&local_80);
    local_48 = OVar4.Storage.field_0;
    OptOffset.Storage.field_0.empty = OVar4.Storage.hasVal;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_48.empty);
    if (!bVar1) {
      Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>::
      Expected<llvm::NoneType_const&>
                ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>> *)
                 __return_storage_ptr__,&None,(type *)0x0);
      return __return_storage_ptr__;
    }
    puVar3 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_48);
    local_28 = *puVar3;
  }
  else {
    local_28 = 0;
    join_0x00000010_0x00000000_ = DataExtractor::getData(&DA->super_DataExtractor);
    pcVar2 = StringRef::data((StringRef *)&OptOffset.Storage.hasVal);
    if (pcVar2 == (char *)0x0) {
      Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>::
      Expected<llvm::NoneType_const&>
                ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>> *)
                 __return_storage_ptr__,&None,(type *)0x0);
      return __return_storage_ptr__;
    }
  }
  Format = DWARFUnitHeader::getFormat(&this->Header);
  parseDWARFStringOffsetsTableHeader
            ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_b0,DA,Format,local_28);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_b0);
  if (bVar1) {
    Val = Expected<llvm::StrOffsetsContributionDescriptor>::operator*
                    ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_b0);
    Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>::
    Expected<llvm::StrOffsetsContributionDescriptor&>
              ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>> *)
               __return_storage_ptr__,Val,(type *)0x0);
  }
  else {
    Expected<llvm::StrOffsetsContributionDescriptor>::takeError
              ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_c8);
    Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::Expected
              (__return_storage_ptr__,(Error *)local_c8);
    Error::~Error((Error *)local_c8);
  }
  Expected<llvm::StrOffsetsContributionDescriptor>::~Expected
            ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Expected<Optional<StrOffsetsContributionDescriptor>>
DWARFUnit::determineStringOffsetsTableContribution(DWARFDataExtractor &DA) {
  uint64_t Offset;
  if (IsDWO) {
    Offset = 0;
    if (DA.getData().data() == nullptr)
      return None;
  } else {
    auto OptOffset = toSectionOffset(getUnitDIE().find(DW_AT_str_offsets_base));
    if (!OptOffset)
      return None;
    Offset = *OptOffset;
  }
  auto DescOrError = parseDWARFStringOffsetsTableHeader(DA, Header.getFormat(), Offset);
  if (!DescOrError)
    return DescOrError.takeError();
  return *DescOrError;
}